

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O2

void __thiscall
mjs::native_object::do_debug_print_extra
          (native_object *this,wostream *os,int indent_incr,int max_nest,int indent)

{
  gc_vector<mjs::native_object::native_object_property> *this_00;
  gc_table *pgVar1;
  native_object_property *pnVar2;
  wostream *pwVar3;
  native_object_property *pnVar4;
  wstring indent_string;
  value local_58;
  
  indent_string._M_dataplus._M_p = (pointer)&indent_string.field_2;
  std::__cxx11::wstring::_M_construct((ulong)&indent_string,indent);
  this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>
            ::dereference(&this->native_properties_,(this->super_object).heap_);
  pgVar1 = gc_vector<mjs::native_object::native_object_property>::tab(this_00);
  pnVar2 = gc_vector<mjs::native_object::native_object_property>::end(this_00);
  for (pnVar4 = (native_object_property *)(pgVar1 + 1); pnVar4 != pnVar2; pnVar4 = pnVar4 + 1) {
    pwVar3 = std::operator<<(os,(wstring *)&indent_string);
    pwVar3 = std::operator<<(pwVar3,pnVar4->name);
    std::operator<<(pwVar3,": ");
    (*pnVar4->get)(&local_58,this);
    debug_print(os,&local_58,indent_incr,1,indent);
    value::~value(&local_58);
    std::operator<<(os,"\n");
  }
  std::__cxx11::wstring::~wstring((wstring *)&indent_string);
  return;
}

Assistant:

void native_object::do_debug_print_extra(std::wostream& os, int indent_incr, int max_nest, int indent) const {
    const auto indent_string = std::wstring(indent, ' ');
    for (const auto& p: native_properties_.dereference(heap())) {
        os << indent_string << p.name << ": ";
        mjs::debug_print(os, p.get(*this), indent_incr, 1, indent);
        os << "\n";
    }
    object::do_debug_print_extra(os, indent_incr, max_nest, indent);
}